

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

void greet_prog_inner_guardian(CHAR_DATA *mob,CHAR_DATA *ch)

{
  bool bVar1;
  char buf [4608];
  
  bVar1 = is_npc(ch);
  if (!bVar1) {
    bVar1 = is_immortal(ch);
    if ((!bVar1) && (ch->cabal != mob->cabal)) {
      sprintf(buf,"Intruder! Intruder! %s is raiding the cabal!",ch->true_name);
      do_cb(mob,buf);
      if (ch->ghost < 1) {
        multi_hit(mob,ch,-1);
      }
      else {
        do_say(mob,"Ghosts aren\'t allowed in here!");
        raw_kill(mob,ch);
      }
    }
  }
  return;
}

Assistant:

void greet_prog_inner_guardian(CHAR_DATA *mob, CHAR_DATA *ch)
{
	char buf[MSL];

	if (is_npc(ch) || is_immortal(ch))
		return;

	if (ch->cabal == mob->cabal)
		return;

	sprintf(buf, "Intruder! Intruder! %s is raiding the cabal!", ch->true_name);
	do_cb(mob, buf);

	if (ch->ghost > 0)
	{
		do_say(mob, "Ghosts aren't allowed in here!");
		raw_kill(mob, ch);
		return;
	}

	multi_hit(mob, ch, TYPE_UNDEFINED);
}